

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurveBase.h
# Opt level: O3

void anurbs::CurveBase<2L>::register_python(module *m)

{
  class_<anurbs::CurveBase<2l>,std::shared_ptr<anurbs::CurveBase<2l>>> *pcVar1;
  string name;
  anon_class_1_0_00000001 local_b9;
  class_<anurbs::CurveBase<2L>,_std::shared_ptr<anurbs::CurveBase<2L>_>_> local_b8;
  long *local_b0;
  long local_a0 [2];
  arg local_90;
  offset_in_Model_to_subr local_80 [2];
  arg local_70;
  arg local_60;
  offset_in_Model_to_subr local_50 [8];
  
  CurveBase<2l>::python_name_abi_cxx11_();
  pybind11::class_<anurbs::CurveBase<2L>,_std::shared_ptr<anurbs::CurveBase<2L>_>_>::class_<>
            (&local_b8,(m->super_object).super_handle.m_ptr,(char *)local_b0);
  local_50[6] = 0x11;
  local_50[7] = 0;
  pcVar1 = (class_<anurbs::CurveBase<2l>,std::shared_ptr<anurbs::CurveBase<2l>>> *)
           pybind11::class_<anurbs::CurveBase<2l>,std::shared_ptr<anurbs::CurveBase<2l>>>::
           def_property_readonly<long(anurbs::CurveBase<2l>::*)()const>
                     ((class_<anurbs::CurveBase<2l>,std::shared_ptr<anurbs::CurveBase<2l>>> *)
                      &local_b8,"degree",local_50 + 6);
  pcVar1 = (class_<anurbs::CurveBase<2l>,std::shared_ptr<anurbs::CurveBase<2l>>> *)
           pybind11::class_<anurbs::CurveBase<2l>,std::shared_ptr<anurbs::CurveBase<2l>>>::
           def_property_readonly<anurbs::CurveBase<2l>::register_python(pybind11::module&)::_lambda(anurbs::CurveBase<2l>&)_1_>
                     (pcVar1,"dimension",&local_b9);
  local_50[4] = 0x19;
  local_50[5] = 0;
  pcVar1 = (class_<anurbs::CurveBase<2l>,std::shared_ptr<anurbs::CurveBase<2l>>> *)
           pybind11::class_<anurbs::CurveBase<2l>,std::shared_ptr<anurbs::CurveBase<2l>>>::
           def_property_readonly<anurbs::Interval(anurbs::CurveBase<2l>::*)()const>
                     (pcVar1,"domain",local_50 + 4);
  local_50[2] = 0x21;
  local_50[3] = 0;
  pcVar1 = (class_<anurbs::CurveBase<2l>,std::shared_ptr<anurbs::CurveBase<2l>>> *)
           pybind11::class_<anurbs::CurveBase<2l>,std::shared_ptr<anurbs::CurveBase<2l>>>::
           def_property_readonly<std::vector<anurbs::Interval,std::allocator<anurbs::Interval>>(anurbs::CurveBase<2l>::*)()const>
                     (pcVar1,"spans",local_50 + 2);
  local_50[0] = 0x31;
  local_50[1] = 0;
  local_60.name = "t";
  local_60._8_1_ = 2;
  local_70.name = "order";
  local_70._8_1_ = 2;
  pcVar1 = (class_<anurbs::CurveBase<2l>,std::shared_ptr<anurbs::CurveBase<2l>>> *)
           pybind11::class_<anurbs::CurveBase<2l>,std::shared_ptr<anurbs::CurveBase<2l>>>::
           def<std::vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>(anurbs::CurveBase<2l>::*)(double,long)const,pybind11::arg,pybind11::arg>
                     (pcVar1,"derivatives_at",local_50,&local_60,&local_70);
  local_80[0] = 0x29;
  local_80[1] = 0;
  local_90.name = "t";
  local_90._8_1_ = 2;
  pybind11::class_<anurbs::CurveBase<2l>,std::shared_ptr<anurbs::CurveBase<2l>>>::
  def<Eigen::Matrix<double,1,2,1,1,2>(anurbs::CurveBase<2l>::*)(double)const,pybind11::arg>
            (pcVar1,"point_at",local_80,&local_90);
  pybind11::object::~object((object *)&local_b8);
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  return;
}

Assistant:

static void register_python(pybind11::module& m)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Type = CurveBase<TDimension>;
        using Holder = Pointer<Type>;

        const std::string name = Type::python_name();

        py::class_<Type, Holder>(m, name.c_str())
            // read-only properties
            .def_property_readonly("degree", &Type::degree)
            .def_property_readonly("dimension", [](Type&) {
                return Type::dimension(); })
            .def_property_readonly("domain", &Type::domain)
            .def_property_readonly("spans", &Type::spans)
            // methods
            .def("derivatives_at", &Type::derivatives_at, "t"_a, "order"_a)
            .def("point_at", &Type::point_at, "t"_a)
        ;
    }